

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__14>
               (json *_v,char *member,anon_class_24_3_07ed8cb9 *cb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  string *err;
  bool bVar4;
  reference pbVar5;
  string *err_00;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *o;
  char *pcVar6;
  json_const_iterator it_1;
  int wrapT;
  int wrapS;
  int magFilter;
  int minFilter;
  json_const_iterator itm;
  json_const_array_iterator it;
  json_const_array_iterator end;
  string local_228;
  string local_208;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  char *local_1d8;
  undefined1 local_1d0 [248];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  json_const_iterator local_98;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  local_98.m_object = (pointer)0x0;
  local_98.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_98.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_98.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar4 = FindMember(_v,"samplers",&local_98);
  if ((bVar4) &&
     (pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_98), pbVar5->m_type == array)) {
    pbVar5 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_98);
    local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_70.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_70.m_object = pbVar5;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_begin(&local_70);
    local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_50.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_1d8 = member;
    local_50.m_object = pbVar5;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_end(&local_50);
    pcVar6 = local_1d8;
    bVar4 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_70,&local_50);
    if (!bVar4) {
      paVar1 = &local_228.field_2;
      paVar2 = &local_208.field_2;
      do {
        err_00 = (string *)
                 nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_70);
        if (*(char *)&(err_00->_M_dataplus)._M_p != '\x01') {
          if ((char *)**(undefined8 **)pcVar6 != (char *)0x0) {
            std::__cxx11::string::append((char *)**(undefined8 **)pcVar6);
          }
          return false;
        }
        local_1d0._0_8_ = local_1d0 + 0x10;
        local_1d0._8_8_ = 0;
        local_1d0[0x10] = '\0';
        local_1d0._32_4_ = -1;
        local_1d0._36_4_ = -1;
        local_1d0._40_4_ = 0x2901;
        local_1d0._44_4_ = 0x2901;
        local_1d0._48_4_ = 0;
        local_1d0._52_4_ = 0;
        local_1d0._56_8_ = 0.0;
        local_1d0._64_8_ = local_1d0 + 0x50;
        local_1d0._72_8_ = 0;
        local_1d0[0x50] = '\0';
        local_1d0._152_4_ = _S_red;
        local_1d0._160_8_ = (_Base_ptr)0x0;
        local_1d0._128_8_ = (pointer)0x0;
        local_1d0._136_8_ = (pointer)0x0;
        local_1d0._112_8_ = (pointer)0x0;
        local_1d0._120_8_ = (pointer)0x0;
        local_1d0._96_8_ = (pointer)0x0;
        local_1d0._104_8_ = (pointer)0x0;
        local_1d0._168_8_ = local_1d0 + 0x98;
        local_1d0._184_8_ = 0;
        local_1d0[0xc0] = false;
        local_1d0._208_4_ = _S_red;
        local_1d0._216_8_ = (_Base_ptr)0x0;
        local_1d0._224_8_ = local_1d0 + 0xd0;
        local_1d0._240_8_ = 0;
        local_d8._M_p = (pointer)&local_c8;
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_b8._M_p = (pointer)&local_a8;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        err = (string *)**(undefined8 **)pcVar6;
        cVar3 = *(char *)(*(long *)(pcVar6 + 8) + 0x19);
        local_228._M_string_length = 4;
        local_228.field_2._M_allocated_capacity._0_5_ = 0x656d616e;
        local_208._M_string_length = 0;
        local_208.field_2._M_local_buf[0] = '\0';
        local_228._M_dataplus._M_p = (pointer)paVar1;
        local_208._M_dataplus._M_p = (pointer)paVar2;
        local_1d0._176_8_ = local_1d0._168_8_;
        local_1d0._232_8_ = local_1d0._224_8_;
        ParseStringProperty((string *)local_1d0,err,(json *)err_00,&local_228,false,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        local_1dc = -1;
        local_1e0 = -1;
        local_1e4 = 0x2901;
        local_1e8 = 0x2901;
        local_228.field_2._M_allocated_capacity = 0x65746c69466e696d;
        local_228._M_string_length = 9;
        local_228.field_2._8_2_ = 0x72;
        local_208._M_string_length = 0;
        local_208.field_2._M_local_buf[0] = '\0';
        local_228._M_dataplus._M_p = (pointer)paVar1;
        local_208._M_dataplus._M_p = (pointer)paVar2;
        ParseIntegerProperty(&local_1dc,err,(json *)err_00,&local_228,false,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        local_228.field_2._M_allocated_capacity = 0x65746c694667616d;
        local_228._M_string_length = 9;
        local_228.field_2._8_2_ = 0x72;
        local_208._M_string_length = 0;
        local_208.field_2._M_local_buf[0] = '\0';
        local_228._M_dataplus._M_p = (pointer)paVar1;
        local_208._M_dataplus._M_p = (pointer)paVar2;
        ParseIntegerProperty(&local_1e0,err,(json *)err_00,&local_228,false,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        local_228._M_string_length = 5;
        local_228.field_2._M_allocated_capacity._0_6_ = 0x5370617277;
        local_208._M_string_length = 0;
        local_208.field_2._M_local_buf[0] = '\0';
        local_228._M_dataplus._M_p = (pointer)paVar1;
        local_208._M_dataplus._M_p = (pointer)paVar2;
        ParseIntegerProperty(&local_1e4,err,(json *)err_00,&local_228,false,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        local_228._M_string_length = 5;
        local_228.field_2._M_allocated_capacity._0_6_ = 0x5470617277;
        local_208._M_string_length = 0;
        local_208.field_2._M_local_buf[0] = '\0';
        local_228._M_dataplus._M_p = (pointer)paVar1;
        local_208._M_dataplus._M_p = (pointer)paVar2;
        ParseIntegerProperty(&local_1e8,err,(json *)err_00,&local_228,false,&local_208);
        pcVar6 = local_1d8;
        o = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p);
          o = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p);
          o = extraout_RDX_01;
        }
        local_1d0._36_4_ = local_1e0;
        local_1d0._32_4_ = local_1dc;
        local_1d0._44_4_ = local_1e8;
        local_1d0._40_4_ = local_1e4;
        ParseExtensionsProperty((ExtensionMap *)(local_1d0 + 200),err_00,o);
        ParseExtrasProperty((Value *)(local_1d0 + 0x30),(json *)err_00);
        if (cVar3 != '\0') {
          local_228._M_dataplus._M_p = (pointer)0x0;
          local_228._M_string_length = 0;
          local_228.field_2._M_allocated_capacity = 0;
          local_228.field_2._8_8_ = 0x8000000000000000;
          bVar4 = FindMember((json *)err_00,"extensions",(json_const_iterator *)&local_228);
          if (bVar4) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_228);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_208,pbVar5,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != paVar2) {
              operator_delete(local_208._M_dataplus._M_p);
            }
          }
          local_228._M_dataplus._M_p = (pointer)0x0;
          local_228._M_string_length = 0;
          local_228.field_2._M_allocated_capacity = 0;
          local_228.field_2._8_8_ = 0x8000000000000000;
          bVar4 = FindMember((json *)err_00,"extras",(json_const_iterator *)&local_228);
          if (bVar4) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_228);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_208,pbVar5,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != paVar2) {
              operator_delete(local_208._M_dataplus._M_p);
            }
          }
        }
        std::vector<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>::
        emplace_back<tinygltf::Sampler>
                  ((vector<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_> *)
                   (**(long **)(pcVar6 + 0x10) + 0xf0),(Sampler *)local_1d0);
        Sampler::~Sampler((Sampler *)local_1d0);
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_70);
        bVar4 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_70,&local_50);
      } while (!bVar4);
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}